

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.cpp
# Opt level: O3

string * __thiscall
TgBot::HttpParser::generateResponse
          (string *__return_storage_ptr__,HttpParser *this,string *data,string *mimeType,
          unsigned_short statusCode,string *statusStr,bool isKeepAlive)

{
  ulong __val;
  bool bVar1;
  uint __val_00;
  char cVar2;
  ulong uVar3;
  char cVar4;
  uint __len;
  char *local_60;
  uint local_58;
  char local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = mimeType;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  __val_00 = (uint)statusCode;
  __len = 1;
  if (((9 < statusCode) && (__len = 2, 99 < statusCode)) && (__len = 3, 999 < __val_00)) {
    __len = 5 - (__val_00 < 10000);
  }
  local_60 = local_50;
  std::__cxx11::string::_M_construct((ulong)&local_60,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_60,__len,__val_00);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60);
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(statusStr->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(local_38->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  __val = data->_M_string_length;
  cVar4 = '\x01';
  if (9 < __val) {
    uVar3 = __val;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (uVar3 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001e365c;
      }
      if (uVar3 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001e365c;
      }
      if (uVar3 < 10000) goto LAB_001e365c;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      cVar2 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_001e365c:
  local_60 = local_50;
  std::__cxx11::string::_M_construct((ulong)&local_60,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_60,local_58,__val);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60);
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(data->_M_dataplus)._M_p);
  return __return_storage_ptr__;
}

Assistant:

string HttpParser::generateResponse(const string& data, const string& mimeType, unsigned short statusCode, const string& statusStr, bool isKeepAlive) const {
    string result;
    result += "HTTP/1.1 ";
    result += std::to_string(statusCode);
    result += ' ';
    result += statusStr;
    result += "\r\nContent-Type: ";
    result += mimeType;
    result += "\r\nContent-Length: ";
    result += std::to_string(data.length());
    result += "\r\nConnection: ";
    if (isKeepAlive) {
        result += "keep-alive";
    } else {
        result += "close";
    }
    result += "\r\n\r\n";
    result += data;
    return result;
}